

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::translate(QPainter *this,QPointF *offset)

{
  undefined1 *puVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->engine)._M_t.
      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
      super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning(local_30,"QPainter::translate: Painter not active");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  else {
    QTransform::translate
              (&(((this_00._M_head_impl)->state)._M_t.
                 super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                 super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl)->worldMatrix,offset->xp
               ,offset->yp);
    puVar1 = &(((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl)->field_0x1a0;
    *puVar1 = *puVar1 | 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPainterPrivate::updateMatrix(this_00._M_head_impl);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::translate(const QPointF &offset)
{
    qreal dx = offset.x();
    qreal dy = offset.y();
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::translate(), dx=%f, dy=%f\n", dx, dy);
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::translate: Painter not active");
        return;
    }

    d->state->worldMatrix.translate(dx, dy);
    d->state->WxF = true;
    d->updateMatrix();
}